

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (NameIdPool<xercesc_4_0::DTDEntityDecl> **objToLoad,int initSize,int initSize2,
               XSerializeEngine *serEng)

{
  XMLSize_t hashModulus;
  bool bVar1;
  uint in_EAX;
  MemoryManager *pMVar2;
  NameIdPool<xercesc_4_0::DTDEntityDecl> *this;
  DTDEntityDecl *this_00;
  uint uVar3;
  uint uStack_38;
  uint itemNumber;
  
  uStack_38 = in_EAX;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    this = *objToLoad;
    if (this == (NameIdPool<xercesc_4_0::DTDEntityDecl> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (NameIdPool<xercesc_4_0::DTDEntityDecl> *)XMemory::operator_new(0x58,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      hashModulus = 0x10;
      if (-1 < initSize) {
        hashModulus = (ulong)(uint)initSize;
      }
      NameIdPool<xercesc_4_0::DTDEntityDecl>::NameIdPool(this,hashModulus,(long)initSize2,pMVar2);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    _uStack_38 = (ulong)uStack_38;
    XSerializeEngine::operator>>(serEng,&itemNumber);
    for (uVar3 = 0; uVar3 < itemNumber; uVar3 = uVar3 + 1) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this_00 = (DTDEntityDecl *)XMemory::operator_new(0x60,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      DTDEntityDecl::DTDEntityDecl(this_00,pMVar2);
      (*(this_00->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable[3])(this_00,serEng);
      NameIdPool<xercesc_4_0::DTDEntityDecl>::put(*objToLoad,this_00);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(NameIdPool<DTDEntityDecl>** objToLoad
                                   , int                          initSize
                                   , int                          initSize2
                                   , XSerializeEngine&            serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             NameIdPool<DTDEntityDecl>(
                                                       initSize
                                                     , initSize2
                                                     , serEng.getMemoryManager()
                                                     );
        }

        serEng.registerObject(*objToLoad);

        unsigned int itemNumber = 0;
        serEng >> itemNumber;

        for (unsigned int itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DTDEntityDecl*  data = new (serEng.getMemoryManager())
                                   DTDEntityDecl(serEng.getMemoryManager());
            data->serialize(serEng);
            (*objToLoad)->put(data);
        }
    }
}